

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkdiskcache.cpp
# Opt level: O0

QString * QNetworkDiskCachePrivate::uniqueFileName(QUrl *url)

{
  char cVar1;
  uint uVar2;
  char *pcVar3;
  QUrl *in_RSI;
  QStringBuilder<QStringBuilder<QString,_char16_t>,_QLatin1String> *in_RDI;
  long in_FS_OFFSET;
  uint code;
  QString *pathFragment;
  QByteArray id;
  QByteArray hash;
  QUrl cleanUrl;
  QStringBuilder<QStringBuilder<QStringBuilder<QString,_char16_t>,_QLatin1String>,_QLatin1String>
  *in_stack_fffffffffffffe48;
  QStringBuilder<QStringBuilder<QString,_char16_t>,_QLatin1String> *a;
  uint in_stack_fffffffffffffe60;
  undefined4 in_stack_fffffffffffffe64;
  qsizetype in_stack_fffffffffffffe78;
  undefined1 local_160 [24];
  undefined1 local_148 [24];
  QByteArray local_130;
  QUrlTwoFlags<QUrl::UrlFormattingOption,_QUrl::ComponentFormattingOption> local_114;
  undefined1 local_110 [24];
  Algorithm local_f8;
  undefined8 local_e8;
  undefined8 local_e0;
  undefined8 local_d8;
  undefined1 local_d0 [24];
  undefined1 local_b8 [24];
  QUrl local_a0 [19];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_a0[0].d = (QUrlPrivate *)0xaaaaaaaaaaaaaaaa;
  a = in_RDI;
  QUrl::QUrl(local_a0,in_RSI);
  QString::QString((QString *)0x283661);
  QUrl::setPassword((QString *)local_a0,(ParsingMode)local_b8);
  QString::~QString((QString *)0x283688);
  QString::QString((QString *)0x283695);
  QUrl::setFragment((QString *)local_a0,(ParsingMode)local_d0);
  QString::~QString((QString *)0x2836b9);
  local_e8 = 0xaaaaaaaaaaaaaaaa;
  local_e0 = 0xaaaaaaaaaaaaaaaa;
  local_d8 = 0xaaaaaaaaaaaaaaaa;
  QUrlTwoFlags<QUrl::UrlFormattingOption,_QUrl::ComponentFormattingOption>::QUrlTwoFlags
            (&local_114,FullyEncoded);
  QUrl::toEncoded((QUrlTwoFlags_conflict1 *)local_110);
  QByteArrayView::QByteArrayView<QByteArray,_true>
            ((QByteArrayView *)CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
             (QByteArray *)a);
  QCryptographicHash::hash((QByteArrayView *)&local_e8,local_f8);
  QByteArray::~QByteArray((QByteArray *)0x283758);
  local_130.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
  local_130.d.ptr = (char *)0xaaaaaaaaaaaaaaaa;
  local_130.d.size = -0x5555555555555556;
  pcVar3 = QByteArray::data((QByteArray *)in_RDI);
  QByteArray::number((longlong)local_148,(int)*(undefined8 *)pcVar3);
  QByteArray::left((QByteArray *)CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
                   in_stack_fffffffffffffe78);
  QByteArray::~QByteArray((QByteArray *)0x2837c5);
  QByteArray::size(&local_130);
  cVar1 = QByteArray::at((QByteArray *)in_stack_fffffffffffffe48,0x2837e6);
  uVar2 = (int)cVar1 & 0xf;
  in_stack_fffffffffffffe60 = in_stack_fffffffffffffe60 & 0xffffff;
  (a->a).a.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
  (a->a).a.d.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
  (a->a).a.d.size = -0x5555555555555556;
  QString::number((uint)local_160,uVar2);
  ::operator+((QString *)a,(char16_t *)in_RDI);
  QLatin1String::QLatin1String
            ((QLatin1String *)CONCAT44(uVar2,in_stack_fffffffffffffe60),(QByteArray *)a);
  ::operator+(&a->a,(QLatin1String *)in_RDI);
  Qt::Literals::StringLiterals::operator____L1((char *)a,(size_t)in_RDI);
  ::operator+(a,(QLatin1String *)in_RDI);
  ::QStringBuilder::operator_cast_to_QString(in_stack_fffffffffffffe48);
  QStringBuilder<QStringBuilder<QStringBuilder<QString,_char16_t>,_QLatin1String>,_QLatin1String>::
  ~QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<QString,_char16_t>,_QLatin1String>,_QLatin1String>
                   *)0x2838cb);
  QStringBuilder<QStringBuilder<QString,_char16_t>,_QLatin1String>::~QStringBuilder
            ((QStringBuilder<QStringBuilder<QString,_char16_t>,_QLatin1String> *)0x2838d8);
  QStringBuilder<QString,_char16_t>::~QStringBuilder((QStringBuilder<QString,_char16_t> *)0x2838e5);
  QString::~QString((QString *)0x2838ef);
  QByteArray::~QByteArray((QByteArray *)0x283912);
  QByteArray::~QByteArray((QByteArray *)0x28391f);
  QUrl::~QUrl(local_a0);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return (QString *)in_RDI;
}

Assistant:

QString QNetworkDiskCachePrivate::uniqueFileName(const QUrl &url)
{
    QUrl cleanUrl = url;
    cleanUrl.setPassword(QString());
    cleanUrl.setFragment(QString());

    const QByteArray hash = QCryptographicHash::hash(cleanUrl.toEncoded(), QCryptographicHash::Sha1);
    // convert sha1 to base36 form and return first 8 bytes for use as string
    const QByteArray id = QByteArray::number(*(qlonglong*)hash.data(), 36).left(8);
    // generates <one-char subdir>/<8-char filename.d>
    uint code = (uint)id.at(id.size()-1) % 16;
    QString pathFragment = QString::number(code, 16) + u'/' + QLatin1StringView(id) + CACHE_POSTFIX;

    return pathFragment;
}